

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenPoseVideo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  char cVar2;
  undefined4 uVar3;
  ostream *poVar4;
  _InputArray *p_Var5;
  int n;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  __m128 t;
  __m128 t_3;
  undefined1 auVar12 [16];
  __m128 t_4;
  undefined1 auVar13 [16];
  __m128 t_2;
  _InputArray local_3d8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  int iStack_3b0;
  int iStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined4 local_398 [2];
  Mat *local_390;
  undefined8 local_388;
  Point maxLoc;
  undefined4 local_378;
  int local_374;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  Mat probMap;
  undefined4 uStack_354;
  Size local_348;
  undefined8 uStack_340;
  double local_2f8;
  double local_2f0;
  int local_2e8;
  int iStack_2e4;
  double prob;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  Net net;
  Size local_2b0;
  undefined1 local_2a8 [16];
  VideoCapture cap;
  string videoFile;
  Mat frame;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  VideoWriter video;
  Mat output;
  long local_158;
  long local_150;
  Matx<double,_4,_1> local_138;
  Matx<double,_4,_1> local_118;
  Mat inpBlob;
  Mat frameCopy;
  int iVar14;
  int iVar15;
  int iVar16;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"USAGE : ./openpose <VideoFile> ");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&videoFile,"sample_video.mp4",(allocator<char> *)&frame);
  if (argc == 2) {
    std::__cxx11::string::assign((char *)&videoFile);
  }
  cv::VideoCapture::VideoCapture(&cap,(string *)&videoFile,0);
  cVar2 = cv::VideoCapture::isOpened();
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to connect to camera");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar6 = 1;
  }
  else {
    cv::Mat::Mat(&frame);
    cv::Mat::Mat(&frameCopy);
    local_3b8 = (double)cv::VideoCapture::get((int)&cap);
    local_3a8 = (double)cv::VideoCapture::get((int)&cap);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inpBlob,"Output-Skeleton.avi",(allocator<char> *)&output);
    uVar3 = cv::VideoWriter::fourcc('M','J','P','G');
    iVar6 = (int)local_3b8;
    iVar8 = (int)local_3a8;
    cv::VideoWriter::VideoWriter((VideoWriter *)0x4024000000000000,&video,&inpBlob,uVar3);
    std::__cxx11::string::~string((string *)&inpBlob);
    cv::dnn::dnn4_v20211004::readNetFromCaffe((string *)&net,(string *)&protoFile_abi_cxx11_);
    auVar1._4_4_ = (float)iVar8;
    auVar1._0_4_ = (float)iVar6;
    local_2a8._0_8_ = 0;
    local_2a8._8_8_ = (_InputArray *)0x406fe00000000000;
    while( true ) {
      iVar6 = cv::waitKey(1);
      if (-1 < iVar6) break;
      local_3b8 = (double)cv::getTickCount();
      cv::VideoCapture::operator>>(&cap,&frame);
      cv::Mat::clone();
      cv::Mat::operator=(&frameCopy,&inpBlob);
      cv::Mat::~Mat(&inpBlob);
      local_348.width = 0;
      local_348.height = 0;
      _probMap = 0x1010000;
      local_3d8.flags = 0x170;
      local_3d8._4_4_ = 0x170;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&output);
      _output = 0;
      cv::dnn::dnn4_v20211004::blobFromImage
                ((_InputArray *)&inpBlob,0.00392156862745098,(Size_ *)&probMap,(Scalar_ *)&local_3d8
                 ,SUB81((string *)&output,0),false,0);
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_3d8.obj = (_InputArray *)&inpBlob;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"",(allocator<char> *)&points);
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&probMap);
      cv::dnn::dnn4_v20211004::Net::setInput
                ((_InputArray *)&net,(string *)&local_3d8,1.0,(Scalar_ *)&output);
      std::__cxx11::string::~string((string *)&output);
      _probMap = &local_348;
      local_348 = (Size)((ulong)local_348 & 0xffffffffffffff00);
      cv::dnn::dnn4_v20211004::Net::forward((string *)&output);
      std::__cxx11::string::~string((string *)&probMap);
      local_3a8 = *(double *)(local_158 + 8);
      uStack_3a0 = 0;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                (&points,(long)nPoints,(allocator_type *)&probMap);
      local_2f8 = (double)(long)local_3b8;
      iVar6 = (int)local_3a8;
      iVar8 = local_3a8._4_4_;
      auVar12._8_4_ = (float)(int)uStack_3a0;
      auVar12._12_4_ = (float)uStack_3a0._4_4_;
      auVar12._4_4_ = (float)(int)local_3a8;
      auVar12._0_4_ = (float)local_3a8._4_4_;
      auVar1._8_8_ = 0;
      auVar12 = divps(auVar1,auVar12);
      for (uVar9 = 0; (long)uVar9 < (long)nPoints; uVar9 = uVar9 + 1) {
        cv::Mat::Mat(&probMap,iVar6,iVar8,5,(void *)(*(long *)(local_150 + 8) * uVar9),0);
        maxLoc.x = 0;
        maxLoc.y = 0;
        local_3d8.sz.width = 0;
        local_3d8.sz.height = 0;
        local_3d8.flags = 0x1010000;
        local_3d8.obj = (_InputArray *)&probMap;
        p_Var5 = (_InputArray *)cv::noArray();
        cv::minMaxLoc(&local_3d8,(double *)0x0,&prob,(Point_ *)0x0,(Point_ *)&maxLoc,p_Var5);
        dVar11 = -0.007812505573383532;
        if (0.009999999776482582 < prob) {
          local_1d8 = auVar12._0_4_;
          fStack_1d4 = auVar12._4_4_;
          fStack_1d0 = auVar12._8_4_;
          fStack_1cc = auVar12._12_4_;
          local_1d8 = (float)maxLoc.x * local_1d8;
          fStack_1d4 = (float)maxLoc.y * fStack_1d4;
          local_388 = 0;
          local_398[0] = 0x3010000;
          local_390 = &frameCopy;
          local_3a8 = (double)CONCAT44(fStack_1d4,local_1d8);
          uStack_3a0 = CONCAT44(fStack_1cc * 0.0,fStack_1d0 * 0.0);
          local_2e8 = (int)local_1d8;
          iStack_2e4 = (int)fStack_1d4;
          iStack_3b0 = (int)(fStack_1d0 * 0.0);
          iStack_3ac = (int)(fStack_1cc * 0.0);
          local_3b8 = (double)CONCAT44(iStack_2e4,local_2e8);
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_3d8);
          local_3d8._0_8_ = local_2a8._0_8_;
          local_3d8.obj = (void *)local_2a8._8_8_;
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0x406fe000;
          uStack_3c0 = 0;
          cv::circle(local_398,&local_2e8,8,&local_3d8,0xffffffffffffffff,8,0);
          local_388 = 0;
          local_398[0] = 0x3010000;
          local_390 = &frameCopy;
          cv::format_abi_cxx11_((char *)&local_3d8,"%d",uVar9 & 0xffffffff);
          local_2f0 = local_3b8;
          cv::Matx<double,_4,_1>::Matx(&local_118);
          local_118.val[0] = 0.0;
          local_118.val[1] = 0.0;
          local_118.val[2] = 255.0;
          local_118.val[3] = 0.0;
          cv::putText(0x3ff199999999999a,local_398,&local_3d8,&local_2f0,3,&local_118,2,8,0);
          std::__cxx11::string::~string((string *)&local_3d8);
          dVar11 = local_3a8;
        }
        points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9].x = (int)ROUND(SUB84(dVar11,0));
        points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9].y = (int)ROUND((float)((ulong)dVar11 >> 0x20));
        cv::Mat::~Mat(&probMap);
      }
      lVar7 = 0;
      while( true ) {
        if (lVar7 == 0xe) break;
        iVar8 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar7][0]].x;
        auVar13._0_4_ = -(uint)(0 < iVar8);
        iVar14 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar7][0]].y;
        auVar13._4_4_ = -(uint)(0 < iVar14);
        iVar15 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar7][1]].x;
        iVar16 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[POSE_PAIRS[lVar7][1]].y;
        auVar13._8_4_ = -(uint)(0 < iVar15);
        auVar13._12_4_ = -(uint)(0 < iVar16);
        iVar6 = movmskps(POSE_PAIRS[lVar7][1],auVar13);
        if (iVar6 == 0xf) {
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x3010000;
          local_3d8.obj = &frame;
          iVar10 = (int)ROUND((float)iVar8);
          iVar6 = (int)ROUND((float)iVar14);
          local_368 = (int)ROUND((float)iVar15);
          iVar8 = (int)ROUND((float)iVar16);
          local_3b8 = (double)CONCAT44(local_3b8._4_4_,local_368);
          local_364 = iVar8;
          local_360 = iVar10;
          local_35c = iVar6;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&probMap);
          _probMap = (Size *)local_2a8._0_8_;
          local_348.width = 0;
          local_348.height = 0x406fe000;
          uStack_340 = 0;
          cv::line(&local_3d8,&local_360,&local_368,&probMap,8,8,0);
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x3010000;
          local_3d8.obj = &frame;
          local_370 = iVar10;
          local_36c = iVar6;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&probMap);
          _probMap = 0;
          uStack_354 = 0;
          local_348.width = 0;
          local_348.height = 0x406fe000;
          uStack_340 = 0;
          cv::circle(&local_3d8,&local_370,8,&probMap,0xffffffffffffffff,8,0);
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x3010000;
          local_3d8.obj = &frame;
          local_378 = (undefined4)local_3b8;
          local_374 = iVar8;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&probMap);
          _probMap = (Size *)0x0;
          local_348.width = 0;
          local_348.height = 0x406fe000;
          uStack_340 = 0;
          cv::circle(&local_3d8,&local_378,8,&probMap,0xffffffffffffffff,8,0);
        }
        lVar7 = lVar7 + 1;
      }
      lVar7 = cv::getTickCount();
      dVar11 = (double)cv::getTickFrequency();
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x3010000;
      local_3d8.obj = &frame;
      cv::format_abi_cxx11_
                ((char *)&probMap,((double)lVar7 - local_2f8) / dVar11,"time taken = %.2f sec");
      local_2b0.width = 0x32;
      local_2b0.height = 0x32;
      cv::Matx<double,_4,_1>::Matx(&local_138);
      local_138.val[0] = 255.0;
      local_138.val[1] = 50.0;
      local_138.val[2] = 0.0;
      local_138.val[3] = 0.0;
      cv::putText(0x3fe999999999999a,&local_3d8,(string *)&probMap,&local_2b0,3,&local_138,2,8,0);
      std::__cxx11::string::~string((string *)&probMap);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&probMap,"Output-Skeleton",(allocator<char> *)local_398);
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_3d8.obj = &frame;
      cv::imshow((string *)&probMap,&local_3d8);
      std::__cxx11::string::~string((string *)&probMap);
      local_348.width = 0;
      local_348.height = 0;
      _probMap = 0x1010000;
      cv::VideoWriter::write((_InputArray *)&video);
      std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                (&points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
      cv::Mat::~Mat(&output);
      cv::Mat::~Mat(&inpBlob);
    }
    cv::VideoCapture::release();
    cv::VideoWriter::release();
    cv::dnn::dnn4_v20211004::Net::~Net(&net);
    cv::VideoWriter::~VideoWriter(&video);
    cv::Mat::~Mat(&frameCopy);
    cv::Mat::~Mat(&frame);
    iVar6 = 0;
  }
  cv::VideoCapture::~VideoCapture(&cap);
  std::__cxx11::string::~string((string *)&videoFile);
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{

    cout << "USAGE : ./openpose <VideoFile> " << endl;
    
    string videoFile = "sample_video.mp4";
    // Take arguments from commmand line
    if (argc == 2)
    {   
      videoFile = argv[1];
    }

    int inWidth = 368;
    int inHeight = 368;
    float thresh = 0.01;    

    cv::VideoCapture cap(videoFile);

    if (!cap.isOpened())
    {
        cerr << "Unable to connect to camera" << endl;
        return 1;
    }
    
    Mat frame, frameCopy;
    int frameWidth = cap.get(CAP_PROP_FRAME_WIDTH);
    int frameHeight = cap.get(CAP_PROP_FRAME_HEIGHT);
    
    VideoWriter video("Output-Skeleton.avi",VideoWriter::fourcc('M','J','P','G'), 10, Size(frameWidth,frameHeight));

    Net net = readNetFromCaffe(protoFile, weightsFile);
    double t=0;
    while( waitKey(1) < 0)
    {       
        double t = (double) cv::getTickCount();

        cap >> frame;
        frameCopy = frame.clone();
        Mat inpBlob = blobFromImage(frame, 1.0 / 255, Size(inWidth, inHeight), Scalar(0, 0, 0), false, false);

        net.setInput(inpBlob);

        Mat output = net.forward();

        int H = output.size[2];
        int W = output.size[3];

        // find the position of the body parts
        vector<Point> points(nPoints);
        for (int n=0; n < nPoints; n++)
        {
            // Probability map of corresponding body's part.
            Mat probMap(H, W, CV_32F, output.ptr(0,n));

            Point2f p(-1,-1);
            Point maxLoc;
            double prob;
            minMaxLoc(probMap, 0, &prob, 0, &maxLoc);
            if (prob > thresh)
            {
                p = maxLoc;
                p.x *= (float)frameWidth / W ;
                p.y *= (float)frameHeight / H ;

                circle(frameCopy, cv::Point((int)p.x, (int)p.y), 8, Scalar(0,255,255), -1);
                cv::putText(frameCopy, cv::format("%d", n), cv::Point((int)p.x, (int)p.y), cv::FONT_HERSHEY_COMPLEX, 1.1, cv::Scalar(0, 0, 255), 2);
            }
            points[n] = p;
        }

        int nPairs = sizeof(POSE_PAIRS)/sizeof(POSE_PAIRS[0]);

        for (int n = 0; n < nPairs; n++)
        {
            // lookup 2 connected body/hand parts
            Point2f partA = points[POSE_PAIRS[n][0]];
            Point2f partB = points[POSE_PAIRS[n][1]];

            if (partA.x<=0 || partA.y<=0 || partB.x<=0 || partB.y<=0)
                continue;

            line(frame, partA, partB, Scalar(0,255,255), 8);
            circle(frame, partA, 8, Scalar(0,0,255), -1);
            circle(frame, partB, 8, Scalar(0,0,255), -1);
        }

        t = ((double)cv::getTickCount() - t)/cv::getTickFrequency();
        cv::putText(frame, cv::format("time taken = %.2f sec", t), cv::Point(50, 50), cv::FONT_HERSHEY_COMPLEX, .8, cv::Scalar(255, 50, 0), 2);
        // imshow("Output-Keypoints", frameCopy);
        imshow("Output-Skeleton", frame);
        video.write(frame);
    }
    // When everything done, release the video capture and write object
    cap.release();
    video.release();

    return 0;
}